

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool gl4cts::EnhancedLayouts::Utils::checkVarying
               (Program *program,Variable *variable,stringstream *stream,bool is_input)

{
  Interface *pIVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  string structVariable;
  GLchar buffer [16];
  
  bVar2 = Variable::IsBlock(variable);
  if (bVar2) {
    pIVar1 = (variable->m_descriptor).field_9.m_interface;
    lVar3 = ((long)(pIVar1->m_members).
                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar1->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    bVar2 = true;
    lVar6 = 0;
    while (bVar9 = lVar3 != 0, lVar3 = lVar3 + -1, bVar9) {
      bVar9 = verifyVarying(program,&pIVar1->m_name,
                            (Descriptor *)
                            ((long)&((pIVar1->m_members).
                                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                    m_expected_component + lVar6),stream,is_input);
      bVar2 = (bool)(bVar2 & bVar9);
      lVar6 = lVar6 + 0x70;
    }
  }
  else {
    bVar2 = Variable::IsStruct(variable);
    if (bVar2) {
      pIVar1 = (variable->m_descriptor).field_9.m_interface;
      uVar4 = ((long)(pIVar1->m_members).
                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pIVar1->m_members).
                    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70;
      std::__cxx11::string::string
                ((string *)&structVariable,(string *)&(variable->m_descriptor).m_name);
      uVar7 = (variable->m_descriptor).m_n_array_elements;
      bVar2 = true;
      if (uVar7 == 0) {
        for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
          bVar9 = verifyVarying(program,&structVariable,
                                (pIVar1->m_members).
                                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar7,stream,is_input);
          bVar2 = (bool)(bVar2 & bVar9);
        }
      }
      else {
        uVar5 = 0;
        while( true ) {
          if (uVar7 <= uVar5) break;
          sprintf(buffer,"%d");
          std::__cxx11::string::append((char *)&structVariable);
          std::__cxx11::string::append((char *)&structVariable);
          std::__cxx11::string::append((char *)&structVariable);
          lVar3 = 0;
          uVar8 = uVar4;
          while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
            bVar9 = verifyVarying(program,&structVariable,
                                  (Descriptor *)
                                  ((long)&((pIVar1->m_members).
                                           super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          m_expected_component + lVar3),stream,is_input);
            bVar2 = (bool)(bVar2 & bVar9);
            lVar3 = lVar3 + 0x70;
          }
          uVar5 = uVar5 + 1;
          uVar7 = (variable->m_descriptor).m_n_array_elements;
        }
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&structVariable,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)buffer);
      bVar2 = verifyVarying(program,&structVariable,&variable->m_descriptor,stream,is_input);
    }
    std::__cxx11::string::~string((string *)&structVariable);
  }
  return bVar2;
}

Assistant:

bool checkVarying(Program& program, const Variable& variable, std::stringstream& stream, bool is_input)
{
	bool result = true;

	if (variable.IsBlock())
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;
		const size_t	  n_members = interface->m_members.size();

		for (size_t i = 0; i < n_members; ++i)
		{
			const Variable::Descriptor& member = interface->m_members[i];
			bool member_result				   = verifyVarying(program, interface->m_name, member, stream, is_input);

			if (false == member_result)
			{
				result = false;
			}
		}
	}
	/*
	 To query the the location of struct member by glGetProgramResource, we need pass the variable name "gs_fs_output[0].single",
	 but in original implementation, the test pass the name "Data.single", which can't get any valid result.
	 struct Data {
	 dmat2 single;
	 dmat2 array[1];
	 };
	 layout (location = 0) in Data gs_fs_output[1];
	 */
	else if (variable.IsStruct())
	{
		Utils::Interface* interface		 = variable.m_descriptor.m_interface;
		const size_t	  n_members		 = interface->m_members.size();
		std::string		  structVariable = variable.m_descriptor.m_name;
		// If struct variable is an array
		if (0 != variable.m_descriptor.m_n_array_elements)
		{
			for (GLuint i = 0; i < variable.m_descriptor.m_n_array_elements; i++)
			{
				GLchar buffer[16];
				sprintf(buffer, "%d", i);
				structVariable.append("[");
				structVariable.append(buffer);
				structVariable.append("]");
				for (size_t j = 0; j < n_members; ++j)
				{
					const Variable::Descriptor& member = interface->m_members[j];
					bool member_result = verifyVarying(program, structVariable, member, stream, is_input);

					if (false == member_result)
					{
						result = false;
					}
				}
			}
		}
		else
		{
			for (GLuint i = 0; i < n_members; ++i)
			{
				const Variable::Descriptor& member = interface->m_members[i];
				bool member_result				   = verifyVarying(program, structVariable, member, stream, is_input);

				if (false == member_result)
				{
					result = false;
				}
			}
		}
	}
	else
	{
		result = verifyVarying(program, "", variable.m_descriptor, stream, is_input);
	}
	return result;
}